

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool Fossilize::merge_concurrent_databases
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  char *path;
  pointer puVar1;
  int iVar2;
  DatabaseInterface *pDVar3;
  undefined7 in_register_00000009;
  size_t sVar4;
  ResourceTag tag;
  uint uVar5;
  ulong uVar6;
  pointer puVar7;
  bool bVar8;
  size_t hash_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  size_t blob_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_type local_98;
  allocator_type local_8d;
  undefined4 local_8c;
  DatabaseInterface *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  size_type local_68;
  size_t local_60;
  char **local_58;
  size_t local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_8c = (undefined4)CONCAT71(in_register_00000009,skip_missing_inputs);
  bVar8 = false;
  local_58 = source_paths;
  local_88 = create_stream_archive_database(append_archive,Append);
  iVar2 = (*local_88->_vptr_DatabaseInterface[2])();
  if ((char)iVar2 != '\0') {
    if (num_source_paths == 0) {
      bVar8 = true;
    }
    else {
      sVar4 = 0;
      local_60 = num_source_paths;
      do {
        path = local_58[sVar4];
        local_50 = sVar4;
        pDVar3 = create_stream_archive_database(path,ReadOnly);
        iVar2 = (*pDVar3->_vptr_DatabaseInterface[2])(pDVar3);
        if ((char)iVar2 == '\0') {
          uVar5 = 1;
          if ((char)local_8c != '\0') {
            fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
            uVar5 = 4;
          }
        }
        else {
          uVar6 = 0;
          do {
            local_98 = 0;
            iVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,uVar6,&local_98,0);
            uVar5 = 1;
            if ((char)iVar2 != '\0') {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_48,local_98,(allocator_type *)&local_80);
              iVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,uVar6,&local_98);
              puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar5 = 1;
              puVar7 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((char)iVar2 != '\0') {
                for (; puVar7 != puVar1; puVar7 = puVar7 + 1) {
                  local_68 = 0;
                  iVar2 = (*pDVar3->_vptr_DatabaseInterface[3])(pDVar3,uVar6,*puVar7,&local_68,0,1);
                  if ((char)iVar2 == '\0') {
LAB_00110d00:
                    uVar5 = 1;
                    goto LAB_00110d29;
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_80,local_68,&local_8d);
                  iVar2 = (*pDVar3->_vptr_DatabaseInterface[3])
                                    (pDVar3,uVar6,*puVar7,&local_68,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
                  if ((char)iVar2 == '\0') {
                    uVar5 = 1;
                    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_80.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_80.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_80.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    goto LAB_00110d29;
                  }
                  iVar2 = (*local_88->_vptr_DatabaseInterface[4])
                                    (local_88,uVar6,*puVar7,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)local_80.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_80.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,1);
                  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_80.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_80.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_80.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((char)iVar2 == '\0') goto LAB_00110d00;
                }
                uVar5 = 0;
              }
LAB_00110d29:
              if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (uVar5 != 0) goto LAB_00110d56;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
          } while (uVar5 != 10);
          uVar5 = 5;
LAB_00110d56:
          if (uVar5 == 5) {
            uVar5 = 0;
          }
        }
        (*pDVar3->_vptr_DatabaseInterface[1])(pDVar3);
        if ((uVar5 & 3) != 0) goto LAB_00110dbd;
        sVar4 = local_50 + 1;
      } while (sVar4 != local_60);
      uVar5 = 2;
LAB_00110dbd:
      bVar8 = uVar5 == 2;
    }
  }
  (*local_88->_vptr_DatabaseInterface[1])();
  return bVar8;
}

Assistant:

bool merge_concurrent_databases(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                bool skip_missing_inputs)
{
	auto append_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::Append));
	if (!append_db->prepare())
		return false;

	for (size_t source = 0; source < num_source_paths; source++)
	{
		const char *path = source_paths[source];
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (!skip_missing_inputs)
				return false;

			LOGW("Archive %s could not be prepared, skipping.\n", path);
			continue;
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t blob_size = 0;
				if (!source_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;
				std::vector<uint8_t> blob(blob_size);
				if (!source_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;

				if (!append_db->write_entry(tag, hash, blob.data(), blob.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
					return false;
			}
		}
	}

	return true;
}